

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUtility.cpp
# Opt level: O1

bool GmmIsYUVFormatLCUAligned(GMM_RESOURCE_FORMAT Format)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((0x16 < Format - GMM_FORMAT_NV12) ||
       ((0x6a0029U >> (Format - GMM_FORMAT_NV12 & 0x1f) & 1) == 0)) &&
      (Format != GMM_FORMAT_YCRCB_NORMAL)) && (Format != GMM_FORMAT_AYUV)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool GMM_STDCALL GmmIsYUVFormatLCUAligned(GMM_RESOURCE_FORMAT Format)
{
    bool Status = 0;

    switch(Format)
    {
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_YUY2:
        case GMM_FORMAT_Y210:
        case GMM_FORMAT_Y410:
        case GMM_FORMAT_Y216:
        case GMM_FORMAT_Y416:
        case GMM_FORMAT_AYUV:
            Status = true;
            break;
        default:
            Status = false;
            break;
    }
    return Status;
}